

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O2

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getColorType
          (TextureCubeMapArraySamplingTest *this,samplerType sampler_type,GLchar **out_color_type,
          GLchar **out_interpolation_type,GLchar **out_sampler_type,GLchar **out_image_type,
          GLchar **out_image_layout,GLuint *out_n_components,bool *out_is_shadow)

{
  int iVar1;
  
  getColorType(this,sampler_type,out_color_type,out_interpolation_type,out_sampler_type,
               out_n_components,out_is_shadow);
  if (sampler_type < (Stencil|Int)) {
    iVar1 = *(int *)(&DAT_017cbcb0 + (ulong)sampler_type * 4);
    *out_image_type = &DAT_017cbc9c + *(int *)(&DAT_017cbc9c + (ulong)sampler_type * 4);
    *out_image_layout = &DAT_017cbcb0 + iVar1;
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getColorType(samplerType sampler_type, const glw::GLchar*& out_color_type,
												   const glw::GLchar*& out_interpolation_type,
												   const glw::GLchar*& out_sampler_type,
												   const glw::GLchar*& out_image_type,
												   const glw::GLchar*& out_image_layout, glw::GLuint& out_n_components,
												   bool& out_is_shadow)
{
	getColorType(sampler_type, out_color_type, out_interpolation_type, out_sampler_type, out_n_components,
				 out_is_shadow);

	switch (sampler_type)
	{
	case Float:
		out_image_type   = image_float;
		out_image_layout = "rgba8";
		break;
	case Depth:
		out_image_type   = image_float;
		out_image_layout = "rgba8";
		break;
	case Int:
		out_image_type   = image_int;
		out_image_layout = "rgba32i";
		break;
	case UInt:
		out_image_type   = image_uint;
		out_image_layout = "rgba32ui";
		break;
	case Stencil:
		out_image_type   = image_uint;
		out_image_layout = "r32ui";
		break;
	};
}